

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SupportVectorClassifier::SupportVectorClassifier
          (SupportVectorClassifier *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SupportVectorClassifier_0034abd8
  ;
  (this->proba_).current_size_ = 0;
  (this->proba_).total_size_ = 0;
  (this->proba_).rep_ = (Rep *)0x0;
  (this->probb_).current_size_ = 0;
  (this->probb_).total_size_ = 0;
  (this->probb_).rep_ = (Rep *)0x0;
  (this->numberofsupportvectorsperclass_).rep_ = (Rep *)0x0;
  (this->rho_).rep_ = (Rep *)0x0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->numberofsupportvectorsperclass_).current_size_ = 0;
  (this->numberofsupportvectorsperclass_).total_size_ = 0;
  (this->coefficients_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->coefficients_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->coefficients_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->coefficients_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->rho_).current_size_ = 0;
  (this->rho_).total_size_ = 0;
  if (this != (SupportVectorClassifier *)&_SupportVectorClassifier_default_instance_) {
    protobuf_SVM_2eproto::InitDefaults();
  }
  this->kernel_ = (Kernel *)0x0;
  this->_oneof_case_[1] = 0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

SupportVectorClassifier::SupportVectorClassifier()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_SVM_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.SupportVectorClassifier)
}